

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiInputEvent *pIVar4;
  long lVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiInputEvent *__dest;
  byte bVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ImGuiContext *g;
  
  pIVar6 = GImGui;
  iVar2 = (GImGui->InputEventsQueue).Size;
  lVar10 = (long)iVar2 + 1;
  lVar5 = (long)iVar2 * 0x18;
  do {
    if (lVar10 + -1 == 0 || lVar10 < 1) {
      lVar9 = 0;
      break;
    }
    pIVar4 = (GImGui->InputEventsQueue).Data;
    lVar9 = (long)&pIVar4[-1].Type + lVar5;
    piVar1 = (int *)((long)&pIVar4[-1].Type + lVar5);
    lVar10 = lVar10 + -1;
    lVar5 = lVar5 + -0x18;
  } while (*piVar1 != 6);
  if (lVar9 == 0) {
    bVar8 = (GImGui->IO).AppFocusLost ^ 1;
  }
  else {
    bVar8 = *(byte *)(lVar9 + 8);
  }
  if ((bool)bVar8 != focused) {
    iVar3 = (GImGui->InputEventsQueue).Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar11 = iVar2 + 1;
      if (iVar2 + 1 < iVar7) {
        iVar11 = iVar7;
      }
      if (iVar3 < iVar11) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar11 * 0x18,GImAllocatorUserData);
        pIVar4 = (pIVar6->InputEventsQueue).Data;
        if (pIVar4 != (ImGuiInputEvent *)0x0) {
          memcpy(__dest,pIVar4,(long)(pIVar6->InputEventsQueue).Size * 0x18);
          pIVar4 = (pIVar6->InputEventsQueue).Data;
          if ((pIVar4 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        (pIVar6->InputEventsQueue).Data = __dest;
        (pIVar6->InputEventsQueue).Capacity = iVar11;
      }
    }
    pIVar4 = (pIVar6->InputEventsQueue).Data;
    iVar2 = (pIVar6->InputEventsQueue).Size;
    pIVar4[iVar2].Type = ImGuiInputEventType_Focus;
    pIVar4[iVar2].Source = ImGuiInputSource_None;
    pIVar4[iVar2].field_2.AppFocused.Focused = focused;
    *(undefined8 *)((long)&pIVar4[iVar2].field_2 + 1) = 0;
    *(undefined8 *)((long)&pIVar4[iVar2].field_2 + 8) = 0;
    (pIVar6->InputEventsQueue).Size = (pIVar6->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Focus);
    const bool latest_focused = latest_event ? latest_event->AppFocused.Focused : !g.IO.AppFocusLost;
    if (latest_focused == focused)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}